

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O3

int big_file_create_records(BigFile *bf,BigRecordType *rtype,char *mode,int Nfile,size_t *fsize)

{
  BigRecordField *pBVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  BigBlock block [1];
  BigBlock local_88;
  
  if (rtype->nfield != 0) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      if (*mode == 'a') {
        if ((mode[1] != '+') || (mode[2] != '\0')) goto LAB_0010b2e2;
        iVar2 = big_file_open_block(bf,&local_88,*(char **)(rtype->fields->dtype + lVar4 + -0x10));
        if (iVar2 != 0) {
          iVar2 = 0x88;
          goto LAB_0010b362;
        }
        iVar2 = big_block_grow(&local_88,Nfile,fsize);
        if (iVar2 != 0) {
          _big_file_raise((char *)0x0,
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                          ,0x8b);
          iVar2 = big_block_close(&local_88);
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = 0x98;
          goto LAB_0010b362;
        }
      }
      else {
        if (((*mode != 'w') || (mode[1] != '+')) || (mode[2] != '\0')) {
LAB_0010b2e2:
          _big_file_raise("Mode string must be `a+` or `w+`, `%s` provided",
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                          ,0x8f,mode);
          return -1;
        }
        pBVar1 = rtype->fields;
        iVar2 = big_file_create_block
                          (bf,&local_88,*(char **)(pBVar1->dtype + lVar4 + -0x10),
                           pBVar1->dtype + lVar4 + -8,*(int *)(pBVar1->dtype + lVar4),Nfile,fsize);
        if (iVar2 != 0) {
          iVar2 = 0x84;
          goto LAB_0010b362;
        }
      }
      iVar2 = big_block_close(&local_88);
      if (iVar2 != 0) {
        iVar2 = 0x93;
LAB_0010b362:
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                        ,iVar2);
        return -1;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar3 < rtype->nfield);
  }
  return 0;
}

Assistant:

int
big_file_create_records(BigFile * bf,
    const BigRecordType * rtype,
    const char * mode,
    int Nfile,
    const size_t fsize[])
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigBlock block[1];
        if (0 == strcmp(mode, "w+")) {
            RAISEIF(0 != big_file_create_block(bf, block,
                             rtype->fields[i].name,
                             rtype->fields[i].dtype,
                             rtype->fields[i].nmemb,
                             Nfile,
                             fsize),
                ex_open,
                NULL);
        } else if (0 == strcmp(mode, "a+")) {
            RAISEIF(0 != big_file_open_block(bf, block, rtype->fields[i].name),
                ex_open,
                NULL);
            RAISEIF(0 != big_block_grow(block, Nfile, fsize),
                ex_grow,
                NULL);
        } else {
            RAISE(ex_open,
                "Mode string must be `a+` or `w+`, `%s` provided",
                mode);
        }
        RAISEIF(0 != big_block_close(block),
            ex_close,
            NULL);
        continue;
        ex_grow:
            RAISEIF(0 != big_block_close(block),
                ex_close,
                NULL);
        ex_open:
        ex_close:
            return -1;
    }
    return 0;
}